

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

Var * __thiscall kratos::VarSlice::get_var_root_parent(VarSlice *this)

{
  Var *pVVar1;
  _func_int **local_28;
  pointer local_20;
  
  pVVar1 = this->parent_var;
  if (pVVar1->type_ == Slice) {
    do {
      Var::as<kratos::VarSlice>((Var *)&stack0xffffffffffffffd8);
      pVVar1 = (Var *)local_28[0x4e];
      if (local_20 != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20);
      }
    } while (pVVar1->type_ == Slice);
  }
  return pVVar1;
}

Assistant:

Var *VarSlice::get_var_root_parent() {
    Var *parent = parent_var;
    while (parent->type() == VarType::Slice) {
        parent = parent->as<VarSlice>()->parent_var;
    }
    return parent;
}